

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::doShowObj(QPDFJob *this,QPDF *pdf)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  Pipeline *pPVar5;
  runtime_error *this_00;
  int encode_flags;
  qpdf_stream_decode_level_e decode_level;
  string local_78;
  QPDFObjectHandle obj;
  string local_48;
  QPDFObjectHandle local_28;
  
  obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar4->show_trailer == true) {
    QPDF::getTrailer((QPDF *)&local_78);
  }
  else {
    QPDF::getObjectByID((QPDF *)&local_78,(int)pdf,peVar4->show_obj);
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&obj,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
  bVar2 = QPDFObjectHandle::isStream(&obj);
  if (bVar2) {
    peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar2 = peVar4->show_filtered_stream_data;
    if ((peVar4->show_raw_stream_data != false) || ((bVar2 & 1U) != 0)) {
      if ((bVar2 & 1U) != 0) {
        bVar3 = QPDFObjectHandle::pipeStreamData(&obj,(Pipeline *)0x0,0,qpdf_dl_all,false,false);
        if (!bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"unable to filter stream data",(allocator<char> *)&local_48
                    );
          QPDFObjectHandle::warnIfPossible(&obj,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_28.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)QPDFObjectHandle::getObjGen(&obj);
          QPDFObjGen::unparse_abi_cxx11_(&local_48,(QPDFObjGen *)&local_28,',');
          std::operator+(&local_78,"unable to get object ",&local_48);
          std::runtime_error::runtime_error(this_00,(string *)&local_78);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        peVar4 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      QPDFLogger::saveToStandardOutput
                ((peVar4->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 true);
      decode_level = qpdf_dl_none;
      QPDFLogger::getSave((QPDFLogger *)&local_78,
                          SUB81((((this->m).
                                  super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr)->log).
                                super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0)
                         );
      encode_flags = 0;
      if ((bVar2 & 1U) != 0) {
        encode_flags = (uint)((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->normalize * 2;
        decode_level = qpdf_dl_all;
      }
      QPDFObjectHandle::pipeStreamData
                (&obj,(Pipeline *)local_78._M_dataplus._M_p,encode_flags,decode_level,false,false);
      psVar1 = &local_78;
      goto LAB_001628d6;
    }
    QPDFLogger::getInfo((QPDFLogger *)&local_48,
                        SUB81((peVar4->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    pPVar5 = Pipeline::operator<<
                       ((Pipeline *)local_48._M_dataplus._M_p,"Object is stream.  Dictionary:\n");
    QPDFObjectHandle::getDict(&local_28);
    QPDFObjectHandle::unparseResolved_abi_cxx11_(&local_78,&local_28);
    pPVar5 = Pipeline::operator<<(pPVar5,&local_78);
    Pipeline::operator<<(pPVar5,"\n");
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_28.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    QPDFLogger::getInfo((QPDFLogger *)&local_48,
                        SUB81((((this->m).
                                super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->log).
                              super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0));
    QPDFObjectHandle::unparseResolved_abi_cxx11_(&local_78,&obj);
    pPVar5 = Pipeline::operator<<((Pipeline *)local_48._M_dataplus._M_p,&local_78);
    Pipeline::operator<<(pPVar5,"\n");
    std::__cxx11::string::~string((string *)&local_78);
  }
  psVar1 = &local_48;
LAB_001628d6:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&obj.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFJob::doShowObj(QPDF& pdf)
{
    QPDFObjectHandle obj;
    if (m->show_trailer) {
        obj = pdf.getTrailer();
    } else {
        obj = pdf.getObjectByID(m->show_obj, m->show_gen);
    }
    bool error = false;
    if (obj.isStream()) {
        if (m->show_raw_stream_data || m->show_filtered_stream_data) {
            bool filter = m->show_filtered_stream_data;
            if (filter && (!obj.pipeStreamData(nullptr, 0, qpdf_dl_all))) {
                QTC::TC("qpdf", "QPDFJob unable to filter");
                obj.warnIfPossible("unable to filter stream data");
                error = true;
            } else {
                // If anything has been written to standard output, this will fail.
                m->log->saveToStandardOutput(true);
                obj.pipeStreamData(
                    m->log->getSave().get(),
                    (filter && m->normalize) ? qpdf_ef_normalize : 0,
                    filter ? qpdf_dl_all : qpdf_dl_none);
            }
        } else {
            *m->log->getInfo() << "Object is stream.  Dictionary:\n"
                               << obj.getDict().unparseResolved() << "\n";
        }
    } else {
        *m->log->getInfo() << obj.unparseResolved() << "\n";
    }
    if (error) {
        throw std::runtime_error("unable to get object " + obj.getObjGen().unparse(','));
    }
}